

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strutil.cc
# Opt level: O1

double google::protobuf::internal::NoLocaleStrtod(char *str,char **endptr)

{
  char *pcVar1;
  int iVar2;
  LogMessage *pLVar3;
  size_t sVar4;
  char *localized_endptr;
  string localized;
  char *temp_endptr;
  undefined8 uStack_120;
  undefined8 local_118;
  double local_108;
  char *local_100;
  ulong local_f8;
  char local_f0 [16];
  char *local_e0;
  LogMessage local_d8;
  LogMessage local_a0;
  LogMessage local_68;
  
  uStack_120 = 0x39c934;
  local_108 = strtod(str,&local_e0);
  if (endptr != (char **)0x0) {
    *endptr = local_e0;
  }
  if (*local_e0 == '.') {
    uStack_120 = 0x39c96e;
    iVar2 = snprintf((char *)&local_118,0x10,"%.1f",0x3ff8000000000000);
    if ((char)local_118 != '1') {
      uStack_120 = 0x39c99b;
      LogMessage::LogMessage
                (&local_68,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/stubs/strutil.cc"
                 ,0x97b);
      uStack_120 = 0x39c9aa;
      pLVar3 = LogMessage::operator<<(&local_68,"CHECK failed: (temp[0]) == (\'1\'): ");
      uStack_120 = 0x39c9b7;
      LogFinisher::operator=((LogFinisher *)&local_d8,pLVar3);
      uStack_120 = 0x39c9c4;
      LogMessage::~LogMessage(&local_68);
    }
    if (*(char *)((long)&uStack_120 + (long)iVar2 + 7) != '5') {
      uStack_120 = 0x39c9f4;
      LogMessage::LogMessage
                (&local_d8,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/stubs/strutil.cc"
                 ,0x97c);
      uStack_120 = 0x39ca05;
      pLVar3 = LogMessage::operator<<(&local_d8,"CHECK failed: (temp[size - 1]) == (\'5\'): ");
      uStack_120 = 0x39ca12;
      LogFinisher::operator=((LogFinisher *)&local_a0,pLVar3);
      uStack_120 = 0x39ca1c;
      LogMessage::~LogMessage(&local_d8);
    }
    if (6 < iVar2) {
      uStack_120 = 0x39ca43;
      LogMessage::LogMessage
                (&local_a0,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/stubs/strutil.cc"
                 ,0x97d);
      uStack_120 = 0x39ca52;
      pLVar3 = LogMessage::operator<<(&local_a0,"CHECK failed: (size) <= (6): ");
      uStack_120 = 0x39ca5f;
      LogFinisher::operator=((LogFinisher *)&local_100,pLVar3);
      uStack_120 = 0x39ca69;
      LogMessage::~LogMessage(&local_a0);
    }
    local_100 = local_f0;
    local_f8 = 0;
    local_f0[0] = '\0';
    uStack_120 = 0x39ca88;
    strlen(str);
    uStack_120 = 0x39ca9a;
    std::__cxx11::string::reserve((ulong)&local_100);
    uStack_120 = 0x39cab6;
    std::__cxx11::string::replace((ulong)&local_100,local_f8,(char *)0x0,(ulong)str);
    uStack_120 = 0x39cacb;
    std::__cxx11::string::append((char *)&local_100,(long)&local_118 + 1);
    uStack_120 = 0x39cadb;
    std::__cxx11::string::append((char *)&local_100);
    pcVar1 = local_100;
    uStack_120 = 0x39caeb;
    local_108 = strtod(local_100,(char **)&local_118);
    if ((endptr != (char **)0x0) &&
       ((long)local_e0 - (long)str < CONCAT71(local_118._1_7_,(char)local_118) - (long)pcVar1)) {
      iVar2 = (int)local_f8;
      uStack_120 = 0x39cb11;
      sVar4 = strlen(str);
      *endptr = str + (CONCAT71(local_118._1_7_,(char)local_118) -
                      (long)(pcVar1 + (iVar2 - (int)sVar4)));
    }
    if (local_100 != local_f0) {
      uStack_120 = 0x39cb3c;
      operator_delete(local_100);
    }
  }
  return local_108;
}

Assistant:

double NoLocaleStrtod(const char *str, char **endptr) {
  // We cannot simply set the locale to "C" temporarily with setlocale()
  // as this is not thread-safe.  Instead, we try to parse in the current
  // locale first.  If parsing stops at a '.' character, then this is a
  // pretty good hint that we're actually in some other locale in which
  // '.' is not the radix character.

  char *temp_endptr;
  double result = strtod(str, &temp_endptr);
  if (endptr != NULL) *endptr = temp_endptr;
  if (*temp_endptr != '.') return result;

  // Parsing halted on a '.'.  Perhaps we're in a different locale?  Let's
  // try to replace the '.' with a locale-specific radix character and
  // try again.
  std::string localized = LocalizeRadix(str, temp_endptr);
  const char *localized_cstr = localized.c_str();
  char *localized_endptr;
  result = strtod(localized_cstr, &localized_endptr);
  if ((localized_endptr - localized_cstr) > (temp_endptr - str)) {
    // This attempt got further, so replacing the decimal must have helped.
    // Update endptr to point at the right location.
    if (endptr != NULL) {
      // size_diff is non-zero if the localized radix has multiple bytes.
      int size_diff = localized.size() - strlen(str);
      // const_cast is necessary to match the strtod() interface.
      *endptr = const_cast<char *>(
          str + (localized_endptr - localized_cstr - size_diff));
    }
  }

  return result;
}